

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

curl_slist * Curl_cookie_list(Curl_easy *data)

{
  Curl_llist_node *n;
  Cookie *co;
  char *data_00;
  curl_slist *pcVar1;
  int iVar2;
  long lVar3;
  curl_slist *list;
  
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  if ((data->cookies == (CookieInfo *)0x0) || (data->cookies->numcookies == 0)) {
LAB_0011fc8b:
    list = (curl_slist *)0x0;
  }
  else {
    lVar3 = 0;
    list = (curl_slist *)0x0;
    do {
      for (n = Curl_llist_head(data->cookies->cookielist + lVar3); n != (Curl_llist_node *)0x0;
          n = Curl_node_next(n)) {
        co = (Cookie *)Curl_node_elem(n);
        if (co->domain == (char *)0x0) {
          iVar2 = 7;
        }
        else {
          data_00 = get_netscape_format(co);
          if (data_00 != (char *)0x0) {
            pcVar1 = Curl_slist_append_nodup(list,data_00);
            if (pcVar1 != (curl_slist *)0x0) {
              iVar2 = 0;
              list = pcVar1;
              goto LAB_0011fc63;
            }
            (*Curl_cfree)(data_00);
          }
          curl_slist_free_all(list);
          iVar2 = 1;
        }
LAB_0011fc63:
        if ((iVar2 != 7) && (iVar2 != 0)) goto LAB_0011fc8b;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x3f);
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return list;
}

Assistant:

struct curl_slist *Curl_cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list;
  Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  list = cookie_list(data);
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  return list;
}